

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O2

int main(void)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  result_type_conflict rVar4;
  result_type_conflict rVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f local_13bc;
  param_type local_13b0;
  mt19937 mersenneRand;
  
  std::operator<<((ostream *)&std::cout,"\ntestRgbToHsv()\n");
  for (iVar2 = 0; iVar2 != 0xd8; iVar2 = iVar2 + 1) {
    uVar1 = (ushort)iVar2 & 0xff;
    mersenneRand._M_x[1]._0_4_ =
         (float)(int)(char)((char)(((ushort)iVar2 & 0xff) / 6) * -6 + (char)iVar2) / 5.0;
    auVar6._0_4_ = (float)(byte)(uVar1 / 0x24);
    auVar6._4_4_ = (float)(byte)((uVar1 / 6) % 6);
    auVar6._8_8_ = 0;
    auVar7 = divps(auVar6,_DAT_00103050);
    mersenneRand._M_x[0] = auVar7._0_8_;
    testRgbToHsv((Vector3f *)&mersenneRand);
  }
  std::operator<<((ostream *)&std::cout,"\ntestHsvToRgb()\n");
  for (iVar2 = 0; iVar2 != 0xd8; iVar2 = iVar2 + 1) {
    uVar1 = (ushort)iVar2 & 0xff;
    mersenneRand._M_x[1]._0_4_ =
         (float)(int)(char)((char)(((ushort)iVar2 & 0xff) / 6) * -6 + (char)iVar2) / 5.0;
    auVar7._0_4_ = (float)(byte)(uVar1 / 0x24);
    auVar7._4_4_ = (float)(byte)((uVar1 / 6) % 6);
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar7,_DAT_00103050);
    mersenneRand._M_x[0] = auVar7._0_8_;
    testHsvToRgb((Vector3f *)&mersenneRand);
  }
  std::operator<<((ostream *)&std::cout,"\ntest random samples\n");
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&mersenneRand);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mersenneRand,0x7b);
  local_13b0._M_a = 0.0;
  local_13b0._M_b = 1.0;
  iVar2 = 100;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    local_13bc.z = std::uniform_real_distribution<float>::operator()
                             ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    local_13bc.x = rVar4;
    local_13bc.y = rVar5;
    testRgbToHsv(&local_13bc);
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    rVar5 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    local_13bc.z = std::uniform_real_distribution<float>::operator()
                             ((uniform_real_distribution<float> *)&local_13b0,&mersenneRand);
    local_13bc.x = rVar4;
    local_13bc.y = rVar5;
    testHsvToRgb(&local_13bc);
  }
  return 0;
}

Assistant:

int main() {
    constexpr int states = 6, states2 = states * states, states3 = states2 * states;
    std::cout << "\ntestRgbToHsv()\n";
    for (int i = 0; i < states3; ++i) {
        testRgbToHsv({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntestHsvToRgb()\n";
    for (int i = 0; i < states3; ++i) {
        testHsvToRgb({
            static_cast<float>(i / states2 % states) / (states - 1),
            static_cast<float>(i / states % states) / (states - 1),
            static_cast<float>(i % states) / (states - 1)
        });
    }
    std::cout << "\ntest random samples\n";
    std::mt19937 mersenneRand;
    mersenneRand.seed(123);
    std::uniform_real_distribution<float> dist(0.0f, 1.0f);
    for (int i = 0; i < 100; ++i) {
        testRgbToHsv({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
        testHsvToRgb({dist(mersenneRand), dist(mersenneRand), dist(mersenneRand)});
    }

    return 0;
}